

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

string * __thiscall
Catch::Detail::rangeToString<Binary_const*,Binary_const*>
          (string *__return_storage_ptr__,Detail *this,Binary *first,Binary *last)

{
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar1;
  size_t sVar2;
  char *pcVar3;
  _Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  _Var4;
  Detail *pDVar5;
  ReusableStringStream rss;
  long *local_70;
  long local_68;
  long local_60 [2];
  string *local_50;
  ReusableStringStream local_48;
  
  local_48.super_NonCopyable._vptr_NonCopyable = (_func_int **)&PTR__ReusableStringStream_001bf958;
  local_50 = __return_storage_ptr__;
  pSVar1 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  sVar2 = StringStreams::add(&pSVar1->super_StringStreams);
  local_48.m_index = sVar2;
  pSVar1 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::getInternal
                     ();
  _Var4._M_head_impl =
       *(basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> **)
        &(pSVar1->super_StringStreams).m_streams.
         super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[sVar2]._M_t.
         super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ;
  local_48.m_oss = (ostream *)_Var4._M_head_impl;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)_Var4._M_head_impl,"{ ",2);
  if (this != (Detail *)first) {
    pcVar3 = "false";
    if ((ulong)(byte)*this != 0) {
      pcVar3 = "true";
    }
    local_70 = local_60;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_70,pcVar3,pcVar3 + ((ulong)(byte)*this ^ 5));
    _Var4._M_head_impl =
         (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48.m_oss;
    std::__ostream_insert<char,std::char_traits<char>>(local_48.m_oss,(char *)local_70,local_68);
    if (local_70 != local_60) {
      operator_delete(local_70,local_60[0] + 1);
    }
    pDVar5 = this + 1;
    if (pDVar5 != (Detail *)first) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)_Var4._M_head_impl,", ",2);
        pcVar3 = "false";
        if ((ulong)(byte)*pDVar5 != 0) {
          pcVar3 = "true";
        }
        local_70 = local_60;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_70,pcVar3,pcVar3 + ((ulong)(byte)*pDVar5 ^ 5));
        _Var4._M_head_impl =
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
             local_48.m_oss;
        std::__ostream_insert<char,std::char_traits<char>>(local_48.m_oss,(char *)local_70,local_68)
        ;
        if (local_70 != local_60) {
          operator_delete(local_70,local_60[0] + 1);
        }
        pDVar5 = pDVar5 + 1;
      } while (pDVar5 != (Detail *)first);
    }
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)_Var4._M_head_impl," }",2);
  std::__cxx11::stringbuf::str();
  ReusableStringStream::~ReusableStringStream(&local_48);
  return local_50;
}

Assistant:

std::string rangeToString(InputIterator first, Sentinel last) {
            ReusableStringStream rss;
            rss << "{ ";
            if (first != last) {
                rss << ::Catch::Detail::stringify(*first);
                for (++first; first != last; ++first)
                    rss << ", " << ::Catch::Detail::stringify(*first);
            }
            rss << " }";
            return rss.str();
        }